

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

int execute_cpuid(uint32_t *regs)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t *regs_local;
  
  uVar1 = *regs;
  if (uVar1 == 0) {
    puVar2 = (uint32_t *)cpuid_basic_info(0);
  }
  else if (uVar1 == 1) {
    puVar2 = (uint32_t *)cpuid_Version_info(1);
  }
  else if (uVar1 == 2) {
    puVar2 = (uint32_t *)cpuid_cache_tlb_info(2);
  }
  else if (uVar1 == 3) {
    puVar2 = (uint32_t *)cpuid_serial_info(3);
  }
  else if (uVar1 == 4) {
    puVar2 = (uint32_t *)cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (uVar1 == 5) {
    puVar2 = (uint32_t *)cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (uVar1 == 6) {
    puVar2 = (uint32_t *)cpuid_Thermal_Power_Management_info(6);
  }
  else if (uVar1 == 7) {
    puVar2 = (uint32_t *)cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (uVar1 == 9) {
    puVar2 = (uint32_t *)cpuid_Direct_Cache_Access_info(9);
  }
  else if (uVar1 == 10) {
    puVar2 = (uint32_t *)cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (uVar1 == 0xb) {
    puVar2 = (uint32_t *)cpuid_Extended_Topology_info(0xb);
  }
  else if (uVar1 == 0xd) {
    puVar2 = (uint32_t *)cpuid_Processor_Extended_States_info(0xd);
  }
  else if (uVar1 == 0xf) {
    puVar2 = (uint32_t *)cpuid_Quality_of_Service_info(0xf);
  }
  else if (uVar1 == 0x80000002) {
    puVar2 = (uint32_t *)cpuid_brand_part1_info(0x80000002);
  }
  else if (uVar1 == 0x80000003) {
    puVar2 = (uint32_t *)cpuid_brand_part2_info(0x80000003);
  }
  else if (uVar1 == 0x80000004) {
    puVar2 = (uint32_t *)cpuid_brand_part3_info(0x80000004);
  }
  else {
    puVar2 = (uint32_t *)cpuid(uVar1);
  }
  uVar1 = puVar2[1];
  uVar3 = puVar2[2];
  uVar4 = puVar2[3];
  *regs = *puVar2;
  regs[1] = uVar1;
  regs[2] = uVar4;
  regs[3] = uVar3;
  return 1;
}

Assistant:

int
execute_cpuid(uint32_t *regs)
{
#if defined(__x86_64__) || defined(_M_AMD64) || defined (_M_X64)
  __asm__ __volatile__ ("cpuid"
                        : "=a" (regs[0]),
                        "=b" (regs[1]),
                        "=c" (regs[2]),
                        "=d" (regs[3])
                        : "0" (regs[0]),
                        "2" (regs[2]));

  return 1;
#else
  return 0;
#endif
}